

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_traits.c
# Opt level: O3

int mpt_type_add(mpt_type_traits *traits)

{
  generic_traits_chunk *pgVar1;
  byte bVar2;
  int iVar3;
  generic_traits_chunk *pgVar4;
  int iVar5;
  
  iVar3 = -1;
  if ((traits != (mpt_type_traits *)0x0) && (traits->size != 0)) {
    pgVar1 = generic_types;
    if (generic_types == (generic_traits_chunk *)0x0) {
      pgVar1 = (generic_traits_chunk *)malloc(0x100);
      if (pgVar1 == (generic_traits_chunk *)0x0) {
        return -4;
      }
      pgVar1->next = (generic_traits_chunk *)0x0;
      pgVar1->used = '\0';
      generic_types = pgVar1;
      atexit(_generic_types_fini);
    }
    bVar2 = pgVar1->used;
    iVar5 = 0x900;
    if (bVar2 == 0x1e) {
      pgVar4 = pgVar1;
      iVar3 = 0x91e;
      do {
        iVar5 = iVar3;
        pgVar1 = pgVar4->next;
        if (pgVar1 == (generic_traits_chunk *)0x0) {
          if (0xfff < iVar5) {
            return -3;
          }
          pgVar1 = (generic_traits_chunk *)malloc(0x100);
          if (pgVar1 == (generic_traits_chunk *)0x0) {
            return -4;
          }
          pgVar1->next = (generic_traits_chunk *)0x0;
          pgVar1->used = '\0';
          pgVar4->next = pgVar1;
          bVar2 = 0;
          break;
        }
        bVar2 = pgVar1->used;
        pgVar4 = pgVar1;
        iVar3 = iVar5 + 0x1e;
      } while (bVar2 == 0x1e);
    }
    iVar3 = -3;
    if ((int)(iVar5 + (uint)bVar2) < 0x1000) {
      pgVar1->used = bVar2 + 1;
      pgVar1->traits[bVar2] = traits;
      iVar3 = iVar5 + (uint)bVar2;
    }
  }
  return iVar3;
}

Assistant:

extern int mpt_type_add(const MPT_STRUCT(type_traits) *traits)
{
	struct generic_traits_chunk *curr;
	int pos = MPT_ENUM(_TypeValueAdd);
	
	/* must have valid size */
	if (!traits || !traits->size) {
		return MPT_ERROR(BadArgument);
	}
	/* create initial traits chunk */
	if (!(curr = generic_types)) {
		if (!(curr = malloc(sizeof(*generic_types)))) {
			return MPT_ERROR(BadOperation);
		}
		curr->next = 0;
		curr->used = 0;
		generic_types = curr;
		atexit(_generic_types_fini);
	}
	/* find available traits chunk entry */
	while (curr->used == MPT_arrsize(curr->traits)) {
		struct generic_traits_chunk *next;
		pos += MPT_arrsize(curr->traits);
		/* append new empty chunk */
		if (!(next = curr->next)) {
			if (pos > MPT_ENUM(_TypeValueMax)) {
				return MPT_ERROR(BadType);
			}
			if (!(next = malloc(sizeof(*next)))) {
				return MPT_ERROR(BadOperation);
			}
			next->next = 0;
			next->used = 0;
			curr->next = next;
		}
		curr = next;
	}
	pos += curr->used;
	if (pos > MPT_ENUM(_TypeValueMax)) {
		return MPT_ERROR(BadType);
	}
	curr->traits[curr->used++] = traits;
	return pos;
}